

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int cvSLdet(CVodeMem cv_mem)

{
  double *pdVar1;
  realtype in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  realtype ratm;
  realtype ratp;
  realtype corr1;
  realtype cest1;
  realtype rd3a;
  realtype rd2b;
  realtype rd2a;
  realtype rd1c;
  realtype rd1b;
  realtype rd1a;
  realtype rsd;
  realtype rsc;
  realtype rsb;
  realtype rsa;
  realtype sqmin;
  realtype saqj;
  realtype sqmaxk;
  realtype s;
  realtype qp;
  realtype saqk;
  realtype sqmax;
  realtype tem;
  realtype adrr;
  realtype drrmax;
  realtype vmax;
  realtype vmin;
  realtype sumrsq;
  realtype sumrat;
  realtype smaxk;
  realtype smink;
  realtype rrtol;
  realtype sqtol;
  realtype vrrt2;
  realtype vrrtol;
  realtype rrcut;
  realtype rr;
  realtype qco [6] [4];
  realtype qc [6] [4];
  realtype vrat [5];
  realtype qjk [4] [4];
  realtype sqmx [4];
  realtype rrc [4];
  realtype drr [4];
  realtype ssmax [4];
  realtype smax [4];
  realtype sigsq [4];
  realtype qkr [4];
  realtype rav [4];
  realtype rat [5] [4];
  int kflag;
  int kmin;
  int it;
  int j;
  int k;
  int i;
  double local_590;
  double local_588;
  double local_580;
  double local_578;
  double local_568;
  double local_560;
  double local_558;
  double local_548;
  double local_540;
  double local_4a8;
  double local_498;
  double local_478;
  double local_460;
  double local_448;
  double local_440;
  double local_438;
  double local_430;
  double local_400;
  double local_3f8 [5];
  double local_3d0;
  double local_3c8;
  double local_3c0;
  double local_3b0 [19];
  double adStack_318 [4];
  double adStack_2f8 [4];
  undefined8 auStack_2d8 [4];
  double adStack_2b8 [4];
  double adStack_298 [4];
  double adStack_278 [6];
  double local_248 [4];
  double adStack_228 [12];
  double adStack_1c8 [4];
  double adStack_1a8 [5];
  double local_180 [3];
  double adStack_168 [5];
  double local_140 [4];
  double local_120 [3];
  double adStack_108 [4];
  double adStack_e8 [4];
  double local_c8 [20];
  int local_28;
  int local_24;
  realtype rrb;
  realtype bb;
  realtype qfac2;
  realtype qfac1;
  
  local_24 = 0;
  local_28 = 0;
  qfac2 = in_RDI;
  for (bb._0_4_ = 1; bb._0_4_ < 4; bb._0_4_ = bb._0_4_ + 1) {
    local_430 = *(double *)((long)qfac2 + 0x4c0 + (long)bb._0_4_ * 8);
    local_438 = 0.0;
    for (bb._4_4_ = 1; bb._4_4_ < 6; bb._4_4_ = bb._4_4_ + 1) {
      if (*(double *)((long)qfac2 + 0x4a0 + (long)bb._4_4_ * 0x20 + (long)bb._0_4_ * 8) <= local_430
         ) {
        local_540 = *(double *)((long)qfac2 + 0x4a0 + (long)bb._4_4_ * 0x20 + (long)bb._0_4_ * 8);
      }
      else {
        local_540 = local_430;
      }
      local_430 = local_540;
      pdVar1 = (double *)((long)qfac2 + 0x4a0 + (long)bb._4_4_ * 0x20 + (long)bb._0_4_ * 8);
      if (local_438 < *pdVar1 || local_438 == *pdVar1) {
        local_548 = *(double *)((long)qfac2 + 0x4a0 + (long)bb._4_4_ * 0x20 + (long)bb._0_4_ * 8);
      }
      else {
        local_548 = local_438;
      }
      local_438 = local_548;
    }
    if (local_430 < local_438 * 1e-10) {
      return -1;
    }
    adStack_168[(long)bb._0_4_ + 4] = local_438;
    adStack_168[bb._0_4_] = local_438 * local_438;
    local_440 = 0.0;
    local_448 = 0.0;
    for (bb._4_4_ = 1; bb._4_4_ < 5; bb._4_4_ = bb._4_4_ + 1) {
      local_c8[(long)bb._4_4_ * 4 + (long)bb._0_4_] =
           *(double *)((long)qfac2 + 0x4a0 + (long)bb._4_4_ * 0x20 + (long)bb._0_4_ * 8) /
           *(double *)((long)qfac2 + 0x4a0 + (long)(bb._4_4_ + 1) * 0x20 + (long)bb._0_4_ * 8);
      local_440 = local_440 + local_c8[(long)bb._4_4_ * 4 + (long)bb._0_4_];
      local_448 = local_c8[(long)bb._4_4_ * 4 + (long)bb._0_4_] *
                  local_c8[(long)bb._4_4_ * 4 + (long)bb._0_4_] + local_448;
    }
    adStack_e8[bb._0_4_] = local_440 * 0.25;
    adStack_278[bb._0_4_] = ABS(local_448 * 0.25 + -(adStack_e8[bb._0_4_] * adStack_e8[bb._0_4_]));
    adStack_298[bb._0_4_] =
         *(double *)((long)qfac2 + 0x4c0 + (long)bb._0_4_ * 8) *
         *(double *)((long)qfac2 + 0x500 + (long)bb._0_4_ * 8) +
         -(*(double *)((long)qfac2 + 0x4e0 + (long)bb._0_4_ * 8) *
          *(double *)((long)qfac2 + 0x4e0 + (long)bb._0_4_ * 8));
    adStack_2b8[bb._0_4_] =
         *(double *)((long)qfac2 + 0x4e0 + (long)bb._0_4_ * 8) *
         *(double *)((long)qfac2 + 0x500 + (long)bb._0_4_ * 8) +
         -(*(double *)((long)qfac2 + 0x4c0 + (long)bb._0_4_ * 8) *
          *(double *)((long)qfac2 + 0x520 + (long)bb._0_4_ * 8));
    auStack_2d8[bb._0_4_] = 0;
    adStack_2f8[bb._0_4_] =
         *(double *)((long)qfac2 + 0x4e0 + (long)bb._0_4_ * 8) *
         *(double *)((long)qfac2 + 0x540 + (long)bb._0_4_ * 8) +
         -(*(double *)((long)qfac2 + 0x500 + (long)bb._0_4_ * 8) *
          *(double *)((long)qfac2 + 0x520 + (long)bb._0_4_ * 8));
    adStack_318[bb._0_4_] =
         *(double *)((long)qfac2 + 0x520 + (long)bb._0_4_ * 8) *
         *(double *)((long)qfac2 + 0x520 + (long)bb._0_4_ * 8) +
         -(*(double *)((long)qfac2 + 0x500 + (long)bb._0_4_ * 8) *
          *(double *)((long)qfac2 + 0x540 + (long)bb._0_4_ * 8));
    for (bb._4_4_ = 1; bb._4_4_ < 6; bb._4_4_ = bb._4_4_ + 1) {
      local_3f8[(long)bb._4_4_ * 4 + (long)bb._0_4_] =
           adStack_318[(long)bb._4_4_ * 4 + (long)bb._0_4_ + -4];
    }
  }
  if (adStack_278[3] <= adStack_278[2]) {
    local_558 = adStack_278[3];
  }
  else {
    local_558 = adStack_278[2];
  }
  if (local_558 <= adStack_278[1]) {
    if (adStack_278[3] <= adStack_278[2]) {
      local_568 = adStack_278[3];
    }
    else {
      local_568 = adStack_278[2];
    }
    local_560 = local_568;
  }
  else {
    local_560 = adStack_278[1];
  }
  if (adStack_278[2] <= adStack_278[3]) {
    local_578 = adStack_278[3];
  }
  else {
    local_578 = adStack_278[2];
  }
  if (adStack_278[1] <= local_578) {
    if (adStack_278[2] <= adStack_278[3]) {
      local_588 = adStack_278[3];
    }
    else {
      local_588 = adStack_278[2];
    }
    local_580 = local_588;
  }
  else {
    local_580 = adStack_278[1];
  }
  if (1e-08 <= local_560) {
    if (ABS(local_3d0) < adStack_168[1] * 1e-10) {
      return -4;
    }
    for (bb._4_4_ = 2; bb._4_4_ < 6; bb._4_4_ = bb._4_4_ + 1) {
      local_3f8[(long)bb._4_4_ * 4 + 2] =
           -(local_3c8 / local_3d0) * local_3f8[(long)bb._4_4_ * 4 + 1] +
           local_3f8[(long)bb._4_4_ * 4 + 2];
    }
    for (bb._4_4_ = 2; bb._4_4_ < 6; bb._4_4_ = bb._4_4_ + 1) {
      local_3f8[(long)bb._4_4_ * 4 + 3] =
           -(local_3c0 / local_3d0) * local_3f8[(long)bb._4_4_ * 4 + 1] +
           local_3f8[(long)bb._4_4_ * 4 + 3];
    }
    if (ABS(local_3b0[1]) < adStack_168[2] * 1e-10) {
      return -4;
    }
    for (bb._4_4_ = 3; bb._4_4_ < 6; bb._4_4_ = bb._4_4_ + 1) {
      local_3f8[(long)bb._4_4_ * 4 + 3] =
           -(local_3b0[2] / local_3b0[1]) * local_3f8[(long)bb._4_4_ * 4 + 2] +
           local_3f8[(long)bb._4_4_ * 4 + 3];
    }
    if (ABS(local_3b0[10]) < adStack_168[3] * 1e-10) {
      return -4;
    }
    local_400 = -local_3b0[0xe] / local_3b0[10];
    if ((local_400 < 1e-10) || (100.0 < local_400)) {
      return -5;
    }
    for (bb._0_4_ = 1; bb._0_4_ < 4; bb._0_4_ = bb._0_4_ + 1) {
      adStack_108[bb._0_4_] =
           local_400 *
           (local_400 * local_400 * (local_400 * adStack_318[bb._0_4_] + adStack_2f8[bb._0_4_]) +
           adStack_2b8[bb._0_4_]) + adStack_298[bb._0_4_];
    }
    local_478 = 0.0;
    for (bb._0_4_ = 1; bb._0_4_ < 4; bb._0_4_ = bb._0_4_ + 1) {
      if (local_478 < ABS(adStack_108[bb._0_4_]) / adStack_168[bb._0_4_]) {
        local_478 = ABS(adStack_108[bb._0_4_]) / adStack_168[bb._0_4_];
      }
    }
    if (0.001 <= local_478) {
      for (rrb._0_4_ = 1; rrb._0_4_ < 4; rrb._0_4_ = rrb._0_4_ + 1) {
        for (bb._0_4_ = 1; bb._0_4_ < 4; bb._0_4_ = bb._0_4_ + 1) {
          dVar2 = local_400 * local_400 *
                  (adStack_2f8[bb._0_4_] * 3.0 + local_400 * 4.0 * adStack_318[bb._0_4_]) +
                  adStack_2b8[bb._0_4_];
          adStack_1a8[(long)bb._0_4_ + 4] = 0.0;
          if (adStack_168[bb._0_4_] * 1e-10 < ABS(dVar2)) {
            adStack_1a8[(long)bb._0_4_ + 4] = -adStack_108[bb._0_4_] / dVar2;
          }
          adStack_1a8[bb._0_4_] = local_400 + adStack_1a8[(long)bb._0_4_ + 4];
        }
        for (bb._0_4_ = 1; bb._0_4_ < 4; bb._0_4_ = bb._0_4_ + 1) {
          dVar2 = adStack_1a8[bb._0_4_];
          local_498 = 0.0;
          for (rrb._4_4_ = 1; rrb._4_4_ < 4; rrb._4_4_ = rrb._4_4_ + 1) {
            local_248[(long)rrb._4_4_ * 4 + (long)bb._0_4_] =
                 dVar2 * (dVar2 * dVar2 * (dVar2 * adStack_318[rrb._4_4_] + adStack_2f8[rrb._4_4_])
                         + adStack_2b8[rrb._4_4_]) + adStack_298[rrb._4_4_];
            if (local_498 <
                ABS(local_248[(long)rrb._4_4_ * 4 + (long)bb._0_4_]) / adStack_168[rrb._4_4_]) {
              local_498 = ABS(local_248[(long)rrb._4_4_ * 4 + (long)bb._0_4_]) /
                          adStack_168[rrb._4_4_];
            }
          }
          adStack_1c8[bb._0_4_] = local_498;
        }
        local_4a8 = adStack_1c8[1] + 1.0;
        for (bb._0_4_ = 1; bb._0_4_ < 4; bb._0_4_ = bb._0_4_ + 1) {
          if (adStack_1c8[bb._0_4_] < local_4a8) {
            local_24 = bb._0_4_;
            local_4a8 = adStack_1c8[bb._0_4_];
          }
        }
        local_400 = adStack_1a8[local_24];
        if (local_4a8 < 0.001) {
          local_28 = 3;
          break;
        }
        for (rrb._4_4_ = 1; rrb._4_4_ < 4; rrb._4_4_ = rrb._4_4_ + 1) {
          adStack_108[rrb._4_4_] = local_248[(long)rrb._4_4_ * 4 + (long)local_24];
        }
      }
      if (0.001 < local_4a8) {
        return -6;
      }
    }
    else {
      local_28 = 2;
    }
  }
  else {
    if (2.5e-07 < local_580) {
      return -2;
    }
    local_400 = (adStack_e8[1] + adStack_e8[2] + adStack_e8[3]) / 3.0;
    local_460 = 0.0;
    for (bb._0_4_ = 1; bb._0_4_ < 4; bb._0_4_ = bb._0_4_ + 1) {
      local_590 = ABS(adStack_e8[bb._0_4_] - local_400);
      if (local_590 < local_460) {
        local_590 = local_460;
      }
      local_460 = local_590;
    }
    if (0.0005 < local_460) {
      return -3;
    }
    local_28 = 1;
  }
  bb._0_4_ = 1;
  while( true ) {
    if (3 < bb._0_4_) {
      if (1e-10 <= local_120[1]) {
        dVar2 = -(2.0 / ((double)*(int *)((long)qfac2 + 0x120) - 1.0)) *
                (-(((double)(*(int *)((long)qfac2 + 0x120) * *(int *)((long)qfac2 + 0x120)) - 1.0) *
                  0.25) * (local_120[2] / local_120[1]) +
                (local_120[2] / local_120[1]) * (local_120[0] / local_120[1]) + -1.0) + 1.0;
        if (1e-10 <= ABS(dVar2)) {
          if (ABS(1.0 / dVar2 - local_400) <= 0.01) {
            if (0.98 < local_400) {
              if (local_28 == 1) {
                local_28 = 4;
              }
              if (local_28 == 2) {
                local_28 = 5;
              }
              if (local_28 == 3) {
                local_28 = 6;
              }
            }
            qfac1._4_4_ = local_28;
          }
          else {
            qfac1._4_4_ = -9;
          }
        }
        else {
          qfac1._4_4_ = -8;
        }
      }
      else {
        qfac1._4_4_ = -8;
      }
      return qfac1._4_4_;
    }
    dVar2 = *(double *)((long)qfac2 + 0x4e0 + (long)bb._0_4_ * 8) * local_400;
    dVar3 = *(double *)((long)qfac2 + 0x500 + (long)bb._0_4_ * 8) * local_400 * local_400;
    dVar4 = dVar2 - dVar3;
    dVar3 = dVar4 - (dVar3 - *(double *)((long)qfac2 + 0x520 + (long)bb._0_4_ * 8) * local_400 *
                             local_400 * local_400);
    if (ABS(dVar4) < adStack_168[(long)bb._0_4_ + 4] * 1e-10) break;
    dVar4 = -(((*(double *)((long)qfac2 + 0x4c0 + (long)bb._0_4_ * 8) - dVar2) - dVar4) - dVar3) /
            dVar4;
    if ((dVar4 < 1e-10) || (4.0 < dVar4)) {
      return -7;
    }
    adStack_168[(long)bb._0_4_ + 8] =
         *(double *)((long)qfac2 + 0x500 + (long)bb._0_4_ * 8) +
         (dVar3 / dVar4) / (local_400 * local_400);
    bb._0_4_ = bb._0_4_ + 1;
  }
  return -7;
}

Assistant:

static int cvSLdet(CVodeMem cv_mem)
{
  int i, k, j, it, kmin = 0, kflag = 0;
  realtype rat[5][4], rav[4], qkr[4], sigsq[4], smax[4], ssmax[4];
  realtype drr[4], rrc[4],sqmx[4], qjk[4][4], vrat[5], qc[6][4], qco[6][4];
  realtype rr, rrcut, vrrtol, vrrt2, sqtol, rrtol;
  realtype smink, smaxk, sumrat, sumrsq, vmin, vmax, drrmax, adrr;
  realtype tem, sqmax, saqk, qp, s, sqmaxk, saqj, sqmin;
  realtype rsa, rsb, rsc, rsd, rd1a, rd1b, rd1c;
  realtype rd2a, rd2b, rd3a, cest1, corr1;
  realtype ratp, ratm, qfac1, qfac2, bb, rrb;

  /* The following are cutoffs and tolerances used by this routine */

  rrcut  = RCONST(0.98);
  vrrtol = RCONST(1.0e-4);
  vrrt2  = RCONST(5.0e-4);
  sqtol  = RCONST(1.0e-3);
  rrtol  = RCONST(1.0e-2);

  rr = ZERO;

  /*  Index k corresponds to the degree of the interpolating polynomial. */
  /*      k = 1 -> q-1          */
  /*      k = 2 -> q            */
  /*      k = 3 -> q+1          */

  /*  Index i is a backward-in-time index, i = 1 -> current time, */
  /*      i = 2 -> previous step, etc    */

  /* get maxima, minima, and variances, and form quartic coefficients  */

  for (k=1; k<=3; k++) {
    smink = cv_mem->cv_ssdat[1][k];
    smaxk = ZERO;

    for (i=1; i<=5; i++) {
      smink = SUNMIN(smink,cv_mem->cv_ssdat[i][k]);
      smaxk = SUNMAX(smaxk,cv_mem->cv_ssdat[i][k]);
    }

    if (smink < TINY*smaxk) {
      kflag = -1;
      return(kflag);
    }
    smax[k] = smaxk;
    ssmax[k] = smaxk*smaxk;

    sumrat = ZERO;
    sumrsq = ZERO;
    for (i=1; i<=4; i++) {
      rat[i][k] = cv_mem->cv_ssdat[i][k] / cv_mem->cv_ssdat[i+1][k];
      sumrat = sumrat + rat[i][k];
      sumrsq = sumrsq + rat[i][k]*rat[i][k];
    }
    rav[k] = FOURTH*sumrat;
    vrat[k] = SUNRabs(FOURTH*sumrsq - rav[k]*rav[k]);

    qc[5][k] = cv_mem->cv_ssdat[1][k] * cv_mem->cv_ssdat[3][k] -
      cv_mem->cv_ssdat[2][k] * cv_mem->cv_ssdat[2][k];
    qc[4][k] = cv_mem->cv_ssdat[2][k] * cv_mem->cv_ssdat[3][k] -
      cv_mem->cv_ssdat[1][k] * cv_mem->cv_ssdat[4][k];
    qc[3][k] = ZERO;
    qc[2][k] = cv_mem->cv_ssdat[2][k] * cv_mem->cv_ssdat[5][k] -
      cv_mem->cv_ssdat[3][k] * cv_mem->cv_ssdat[4][k];
    qc[1][k] = cv_mem->cv_ssdat[4][k] * cv_mem->cv_ssdat[4][k] -
      cv_mem->cv_ssdat[3][k] * cv_mem->cv_ssdat[5][k];

    for (i=1; i<=5; i++)
      qco[i][k] = qc[i][k];

  }                            /* End of k loop */

  /* Isolate normal or nearly-normal matrix case. The three quartics will
     have a common or nearly-common root in this case.
     Return a kflag = 1 if this procedure works. If the three roots
     differ more than vrrt2, return error kflag = -3.    */

  vmin = SUNMIN(vrat[1],SUNMIN(vrat[2],vrat[3]));
  vmax = SUNMAX(vrat[1],SUNMAX(vrat[2],vrat[3]));

  if (vmin < vrrtol*vrrtol) {

    if (vmax > vrrt2*vrrt2) {
      kflag = -2;
      return(kflag);
    } else {
      rr = (rav[1] + rav[2] + rav[3])/THREE;
      drrmax = ZERO;
      for (k = 1;k<=3;k++) {
        adrr = SUNRabs(rav[k] - rr);
        drrmax = SUNMAX(drrmax, adrr);
      }
      if (drrmax > vrrt2) { kflag = -3; return(kflag); }

      kflag = 1;

      /*  can compute charactistic root, drop to next section   */
    }

  } else {

    /* use the quartics to get rr. */

    if (SUNRabs(qco[1][1]) < TINY*ssmax[1]) {
      kflag = -4;
      return(kflag);
    }

    tem = qco[1][2]/qco[1][1];
    for (i=2; i<=5; i++) {
      qco[i][2] = qco[i][2] - tem*qco[i][1];
    }

    qco[1][2] = ZERO;
    tem = qco[1][3]/qco[1][1];
    for (i=2; i<=5; i++) {
      qco[i][3] = qco[i][3] - tem*qco[i][1];
    }
    qco[1][3] = ZERO;

    if (SUNRabs(qco[2][2]) < TINY*ssmax[2]) {
      kflag = -4;
      return(kflag);
    }

    tem = qco[2][3]/qco[2][2];
    for (i=3; i<=5; i++) {
      qco[i][3] = qco[i][3] - tem*qco[i][2];
    }

    if (SUNRabs(qco[4][3]) < TINY*ssmax[3]) {
      kflag = -4;
      return(kflag);
    }

    rr = -qco[5][3]/qco[4][3];

    if (rr < TINY || rr > HUNDRED) {
      kflag = -5;
      return(kflag);
    }

    for (k=1; k<=3; k++)
      qkr[k] = qc[5][k] + rr*(qc[4][k] + rr*rr*(qc[2][k] + rr*qc[1][k]));

    sqmax = ZERO;
    for (k=1; k<=3; k++) {
      saqk = SUNRabs(qkr[k])/ssmax[k];
      if (saqk > sqmax) sqmax = saqk;
    }

    if (sqmax < sqtol) {
      kflag = 2;

      /*  can compute charactistic root, drop to "given rr,etc"   */

    } else {

      /* do Newton corrections to improve rr.  */

      for (it=1; it<=3; it++) {
        for (k=1; k<=3; k++) {
          qp = qc[4][k] + rr*rr*(THREE*qc[2][k] + rr*FOUR*qc[1][k]);
          drr[k] = ZERO;
          if (SUNRabs(qp) > TINY*ssmax[k]) drr[k] = -qkr[k]/qp;
          rrc[k] = rr + drr[k];
        }

        for (k=1; k<=3; k++) {
          s = rrc[k];
          sqmaxk = ZERO;
          for (j=1; j<=3; j++) {
            qjk[j][k] = qc[5][j] + s*(qc[4][j] + s*s*(qc[2][j] + s*qc[1][j]));
            saqj = SUNRabs(qjk[j][k])/ssmax[j];
            if (saqj > sqmaxk) sqmaxk = saqj;
          }
          sqmx[k] = sqmaxk;
        }

        sqmin = sqmx[1] + ONE;
        for (k=1; k<=3; k++) {
          if (sqmx[k] < sqmin) {
            kmin = k;
            sqmin = sqmx[k];
          }
        }
        rr = rrc[kmin];

        if (sqmin < sqtol) {
          kflag = 3;
          /*  can compute charactistic root   */
          /*  break out of Newton correction loop and drop to "given rr,etc" */
          break;
        } else {
          for (j=1; j<=3; j++) {
            qkr[j] = qjk[j][kmin];
          }
        }
      } /*  end of Newton correction loop  */

      if (sqmin > sqtol) {
        kflag = -6;
        return(kflag);
      }
    } /*  end of if (sqmax < sqtol) else   */
  } /*  end of if (vmin < vrrtol*vrrtol) else, quartics to get rr. */

  /* given rr, find sigsq[k] and verify rr.  */
  /* All positive kflag drop to this section  */

  for (k=1; k<=3; k++) {
    rsa = cv_mem->cv_ssdat[1][k];
    rsb = cv_mem->cv_ssdat[2][k]*rr;
    rsc = cv_mem->cv_ssdat[3][k]*rr*rr;
    rsd = cv_mem->cv_ssdat[4][k]*rr*rr*rr;
    rd1a = rsa - rsb;
    rd1b = rsb - rsc;
    rd1c = rsc - rsd;
    rd2a = rd1a - rd1b;
    rd2b = rd1b - rd1c;
    rd3a = rd2a - rd2b;

    if (SUNRabs(rd1b) < TINY*smax[k]) {
      kflag = -7;
      return(kflag);
    }

    cest1 = -rd3a/rd1b;
    if (cest1 < TINY || cest1 > FOUR) {
      kflag = -7;
      return(kflag);
    }
    corr1 = (rd2b/cest1)/(rr*rr);
    sigsq[k] = cv_mem->cv_ssdat[3][k] + corr1;
  }

  if (sigsq[2] < TINY) {
    kflag = -8;
    return(kflag);
  }

  ratp = sigsq[3]/sigsq[2];
  ratm = sigsq[1]/sigsq[2];
  qfac1 = FOURTH*(cv_mem->cv_q*cv_mem->cv_q - ONE);
  qfac2 = TWO/(cv_mem->cv_q - ONE);
  bb = ratp*ratm - ONE - qfac1*ratp;
  tem = ONE - qfac2*bb;

  if (SUNRabs(tem) < TINY) {
    kflag = -8;
    return(kflag);
  }

  rrb = ONE/tem;

  if (SUNRabs(rrb - rr) > rrtol) {
    kflag = -9;
    return(kflag);
  }

  /* Check to see if rr is above cutoff rrcut  */
  if (rr > rrcut) {
    if (kflag == 1) kflag = 4;
    if (kflag == 2) kflag = 5;
    if (kflag == 3) kflag = 6;
  }

  /* All positive kflag returned at this point  */

  return(kflag);

}